

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subset.hpp
# Opt level: O1

bool __thiscall
ut11::Operands::IsIterableContainingSubset<std::vector<int,std::allocator<int>>>::operator()
          (IsIterableContainingSubset<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  expectedIterators;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  actualIterators;
  _List_node_base local_50;
  list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_38;
  
  IsIterableContainingSubset<std::vector<int,_std::allocator<int>_>_>::
  CreateIteratorListFromInput<std::vector<int,_std::allocator<int>_>_>(&local_38,actual);
  IsIterableContainingSubset<std::vector<int,_std::allocator<int>_>_>::
  CreateIteratorListFromInput<std::vector<int,_std::allocator<int>_>_>
            ((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_50,*(vector<int,_std::allocator<int>_> **)this);
  do {
    p_Var2 = local_50._M_next;
    if (local_50._M_next == &local_50) break;
    bVar3 = CompareListsAndRemoveFirstDuplicate<std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>,std::__cxx11::list<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::allocator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>
                      ((list<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&local_50,&local_38);
  } while (bVar3);
  while (local_50._M_next != &local_50) {
    p_Var1 = (((_List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&(local_50._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(local_50._M_next);
    local_50._M_next = p_Var1;
  }
  while (local_38.
         super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_38) {
    p_Var1 = (((_List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)&(local_38.
                    super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_38.
                    super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
    local_38.
    super__List_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  return p_Var2 == &local_50;
}

Assistant:

bool operator()(const U& actual) const
			{
				auto actualIterators = CreateIteratorListFromInput(actual);
				auto expectedIterators = CreateIteratorListFromInput(m_expected);

				while( !expectedIterators.empty() )
				{
					if  (CompareListsAndRemoveFirstDuplicate(expectedIterators, actualIterators))
						continue;

					return false;
				}
				return true;
			}